

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O0

void calc_similarity(float *numeric_data,int *categ_data,float *Xc,int *Xc_ind,int *Xc_indptr,
                    size_t nrows,bool use_long_double,int nthreads,bool assume_full_distr,
                    bool standardize_dist,bool as_kernel,IsoForest *model_outputs,
                    ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,size_t n_from,
                    bool use_indexed_references,TreesIndexer *indexer,bool is_col_major,
                    size_t ld_numeric,size_t ld_categ)

{
  int *in_RCX;
  int *in_RDX;
  float *unaff_RBX;
  float *in_RSI;
  int *in_RDI;
  size_t in_R8;
  undefined8 in_R9;
  int in_stack_00000018;
  IsoForest *in_stack_00000038;
  ExtIsoForest *in_stack_00000040;
  double *in_stack_00000048;
  double *in_stack_00000050;
  undefined1 in_stack_00000058;
  undefined7 in_stack_00000059;
  undefined1 in_stack_00000068;
  undefined7 in_stack_00000069;
  size_t in_stack_00000078;
  size_t in_stack_00000080;
  
  calc_similarity<float,int>
            (unaff_RBX,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,SUB81((ulong)in_R9 >> 0x38,0),
             in_stack_00000018,SUB81((ulong)in_R9 >> 0x30,0),SUB81((ulong)in_R9 >> 0x28,0),
             SUB81((ulong)in_R9 >> 0x20,0),in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,CONCAT71(in_stack_00000059,in_stack_00000058),
             SUB81((ulong)in_R9 >> 0x18,0),
             (TreesIndexer *)CONCAT71(in_stack_00000069,in_stack_00000068),
             SUB81((ulong)in_R9 >> 0x10,0),in_stack_00000078,in_stack_00000080);
  return;
}

Assistant:

ISOTREE_EXPORTED void calc_similarity(real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, bool use_long_double, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    calc_similarity<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     Xc, Xc_ind, Xc_indptr,
                     nrows, use_long_double, nthreads,
                     assume_full_distr, standardize_dist, as_kernel,
                     model_outputs, model_outputs_ext,
                     tmat, rmat, n_from, use_indexed_references,
                     indexer, is_col_major, ld_numeric, ld_categ);
}